

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extension_install_info.cpp
# Opt level: O3

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::ExtensionInstallInfo::Deserialize(ExtensionInstallInfo *this,Deserializer *deserializer)

{
  ExtensionInstallMode EVar1;
  int iVar2;
  uint uVar3;
  void *__s;
  pointer pEVar4;
  pointer *__ptr;
  string str;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  __s = operator_new(0x88);
  switchD_012e3010::default(__s,0,0x88);
  *(long *)((long)__s + 8) = (long)__s + 0x18;
  *(undefined1 *)((long)__s + 0x18) = 0;
  *(long *)((long)__s + 0x28) = (long)__s + 0x38;
  *(undefined1 *)((long)__s + 0x38) = 0;
  *(long *)((long)__s + 0x48) = (long)__s + 0x58;
  *(undefined1 *)((long)__s + 0x58) = 0;
  *(long *)((long)__s + 0x68) = (long)__s + 0x78;
  *(undefined1 *)((long)__s + 0x78) = 0;
  *(void **)this = __s;
  pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"mode");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    EVar1 = EnumUtil::FromString<duckdb::ExtensionInstallMode>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    EVar1 = (ExtensionInstallMode)iVar2;
  }
  pEVar4->mode = EVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"full_path");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pEVar4->full_path,(string *)&local_50);
    if (local_50 != local_40) goto LAB_0173c1c1;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pEVar4->full_path,(string *)&local_50);
    if (local_50 != local_40) {
LAB_0173c1c1:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"repository_url");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pEVar4->repository_url,(string *)&local_50);
    if (local_50 != local_40) goto LAB_0173c25d;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pEVar4->repository_url,(string *)&local_50);
    if (local_50 != local_40) {
LAB_0173c25d:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"version");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pEVar4->version,(string *)&local_50);
    if (local_50 != local_40) goto LAB_0173c2f9;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pEVar4->version,(string *)&local_50);
    if (local_50 != local_40) {
LAB_0173c2f9:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  pEVar4 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"etag");
  if ((char)uVar3 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pEVar4->etag,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0173c39a;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pEVar4->etag,(string *)&local_50);
    if (local_50 == local_40) goto LAB_0173c39a;
  }
  operator_delete(local_50);
LAB_0173c39a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar3 & 0xff));
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

unique_ptr<ExtensionInstallInfo> ExtensionInstallInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtensionInstallInfo>(new ExtensionInstallInfo());
	deserializer.ReadProperty<ExtensionInstallMode>(100, "mode", result->mode);
	deserializer.ReadPropertyWithDefault<string>(101, "full_path", result->full_path);
	deserializer.ReadPropertyWithDefault<string>(102, "repository_url", result->repository_url);
	deserializer.ReadPropertyWithDefault<string>(103, "version", result->version);
	deserializer.ReadPropertyWithDefault<string>(104, "etag", result->etag);
	return result;
}